

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtexthtmlparser.cpp
# Opt level: O2

void __thiscall QTextHtmlParser::applyAttributes(QTextHtmlParser *this,QStringList *attributes)

{
  QTextCharFormat *this_00;
  QString *pQVar1;
  QTextBlockFormat *this_01;
  QTextLength *width;
  qreal *destination;
  QTextLength *pQVar2;
  qreal *pqVar3;
  qreal *pqVar4;
  QBrush *this_02;
  int *destination_00;
  int *destination_01;
  QString *pQVar5;
  qreal *pqVar6;
  qreal *pqVar7;
  QString *pQVar8;
  int *destination_02;
  double dVar9;
  QTextHTMLElements QVar10;
  uint uVar11;
  QAnyStringView name;
  QAnyStringView name_00;
  QAnyStringView name_01;
  QStringTokenizerBaseBase QVar12;
  QStringTokenizerBaseBase QVar13;
  QStringTokenizerBaseBase QVar14;
  QStringTokenizerBaseBase QVar15;
  char16_t *pcVar16;
  MarkerType marker;
  VerticalAlignment alignment;
  bool bVar17;
  char cVar18;
  int iVar19;
  Alignment AVar20;
  iterator iVar21;
  QString *pQVar22;
  byte bVar23;
  uint uVar24;
  ulong uVar25;
  char16_t *pcVar26;
  int iVar27;
  QFlagsStorage<Qt::AlignmentFlag> aalignment;
  LayoutDirection direction;
  QTextLength *width_00;
  QArrayDataPointer<char16_t> *pQVar28;
  qreal *destination_03;
  int i;
  ulong uVar29;
  long in_FS_OFFSET;
  initializer_list<QString> args;
  QColor color;
  initializer_list<QString> args_00;
  QColor QVar30;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 in_stack_fffffffffffffde8;
  QTextHtmlParserNode *pQVar31;
  QTextHtmlParserNode *this_03;
  QStringView local_170;
  QArrayDataPointer<char16_t> local_160;
  QStringView local_148;
  QArrayDataPointer<char16_t> local_138;
  QArrayDataPointer<char16_t> local_118;
  QArrayDataPointer<char16_t> local_f8;
  QArrayDataPointer<char16_t> local_d8;
  QArrayDataPointer<QString> local_b8;
  iterator __begin6;
  QStringTokenizerBase<QStringView,_QChar> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_d8.size = 0;
  local_f8.size = 0;
  local_d8.d = (Data *)0x0;
  local_d8.ptr = (char16_t *)0x0;
  local_f8.d = (Data *)0x0;
  local_f8.ptr = (char16_t *)0x0;
  if (((attributes->d).size & 1) == 0) {
    iVar21 = QList<QTextHtmlParserNode_*>::end(&this->nodes);
    this_03 = iVar21.i[-1];
    this_01 = &this_03->blockFormat;
    width = &this_03->width;
    destination = &this_03->tableBorder;
    pQVar2 = &this_03->height;
    pqVar3 = &this_03->tableCellPadding;
    pqVar4 = &this_03->tableCellSpacing;
    this_02 = &this_03->borderBrush;
    this_00 = &this_03->charFormat;
    destination_00 = &this_03->tableCellColSpan;
    destination_01 = &this_03->tableCellRowSpan;
    pQVar1 = &this_03->text;
    pQVar5 = &this_03->imageAlt;
    pqVar6 = &this_03->imageHeight;
    pqVar7 = &this_03->imageWidth;
    pQVar8 = &this_03->imageName;
    destination_02 = &this_03->listStart;
    bVar23 = 0;
    for (uVar29 = 0; uVar29 < (ulong)(attributes->d).size; uVar29 = uVar29 + 2) {
      pQVar22 = (attributes->d).ptr;
      local_118.d = pQVar22[uVar29].d.d;
      local_118.ptr = pQVar22[uVar29].d.ptr;
      local_118.size = pQVar22[uVar29].d.size;
      if (local_118.d != (Data *)0x0) {
        LOCK();
        ((local_118.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_118.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
        pQVar22 = (attributes->d).ptr;
      }
      uVar25 = uVar29 | 1;
      local_138.d = *(Data **)(pQVar22 + uVar25);
      local_138.ptr = pQVar22[uVar25].d.ptr;
      local_138.size = pQVar22[uVar25].d.size;
      if ((QStringTokenizerBaseBase)local_138.d != (QStringTokenizerBaseBase)0x0) {
        LOCK();
        *(int *)local_138.d = *(int *)local_138.d + 1;
        UNLOCK();
      }
      QVar10 = this_03->id;
      switch(QVar10) {
      case Html_font:
        __begin6.tokenizer._0_4_ = 4;
        __begin6.tokenizer._4_4_ = 0;
        __begin6.current.value.m_size._0_4_ = 0x60e7be;
        __begin6.current.value.m_size._4_4_ = 0;
        bVar17 = ::operator==((QString *)&local_118,(QLatin1StringView *)&__begin6);
        if ((bVar17) && ((char16_t *)local_138.size != (char16_t *)0x0)) {
          iVar19 = QString::toInt((QString *)&local_138,(bool *)0x0,10);
          iVar27 = iVar19 + -3;
          if ((*local_138.ptr + L'ￕ' & 0xfffdU) == 0) {
            iVar27 = iVar19;
          }
          ::QVariant::QVariant((QVariant *)&__begin6,iVar27);
          QTextFormat::setProperty(&this_00->super_QTextFormat,0x2002,(QVariant *)&__begin6);
          ::QVariant::~QVariant((QVariant *)&__begin6);
        }
        else {
          __begin6.tokenizer._0_4_ = 4;
          __begin6.tokenizer._4_4_ = 0;
          __begin6.current.value.m_size._0_4_ = 0x6087cd;
          __begin6.current.value.m_size._4_4_ = 0;
          bVar17 = ::operator==((QString *)&local_118,(QLatin1StringView *)&__begin6);
          if (bVar17) {
            bVar17 = QString::contains((QString *)&local_138,(QChar)0x2c,CaseSensitive);
            if (bVar17) {
              local_b8.size = 0;
              local_b8.d = (Data *)0x0;
              local_b8.ptr = (QString *)0x0;
              local_58.super_QStringTokenizerBaseBase.m_sb.
              super_QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>.
              super_QFlagsStorage<Qt::SplitBehaviorFlags>.i =
                   (QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>)0x0;
              local_58.super_QStringTokenizerBaseBase.m_cs = CaseSensitive;
              local_58.m_haystack.m_size = local_138.size;
              local_58.m_haystack.m_data = local_138.ptr;
              local_58.m_needle.ucs = L',';
              __begin6.current.state.extra = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
              __begin6.current.state.start = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
              __begin6.current.state.end = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
              __begin6.current.value.m_data._0_4_ = 0xaaaaaaaa;
              __begin6.current.value.m_data._4_4_ = 0xaaaaaaaa;
              __begin6.current._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
              __begin6.tokenizer._0_4_ = 0xaaaaaaaa;
              __begin6.tokenizer._4_4_ = 0xaaaaaaaa;
              __begin6.current.value.m_size._0_4_ = 0xaaaaaaaa;
              __begin6.current.value.m_size._4_4_ = 0xaaaaaaaa;
              QStringTokenizerBase<QStringView,_QChar>::iterator::iterator(&__begin6,&local_58);
              while (__begin6.current.ok != false) {
                local_148.m_size =
                     CONCAT44(__begin6.current.value.m_size._4_4_,
                              (undefined4)__begin6.current.value.m_size);
                local_148.m_data =
                     (storage_type_conflict *)
                     CONCAT44(__begin6.current.value.m_data._4_4_,
                              __begin6.current.value.m_data._0_4_);
                local_170 = QStringView::trimmed(&local_148);
                QStringView::toString((QString *)&local_160,&local_170);
                QList<QString>::emplaceBack<QString>
                          ((QList<QString> *)&local_b8,(QString *)&local_160);
                QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_160);
                QStringTokenizerBase<QStringView,_QChar>::iterator::advance(&__begin6);
              }
              QTextCharFormat::setFontFamilies(this_00,(QStringList *)&local_b8);
              QArrayDataPointer<QString>::~QArrayDataPointer(&local_b8);
            }
            else {
              QList<QString>::QList<QString,void>((QList<QString> *)&__begin6,(QString *)&local_138)
              ;
              QTextCharFormat::setFontFamilies(this_00,(QStringList *)&__begin6);
              QArrayDataPointer<QString>::~QArrayDataPointer
                        ((QArrayDataPointer<QString> *)&__begin6);
            }
          }
          else {
            __begin6.tokenizer._0_4_ = 5;
            __begin6.tokenizer._4_4_ = 0;
            __begin6.current.value.m_size._0_4_ = 0x60e0b2;
            __begin6.current.value.m_size._4_4_ = 0;
            bVar17 = ::operator==((QString *)&local_118,(QLatin1StringView *)&__begin6);
            if (!bVar17) break;
            local_b8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
            local_b8.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
            name_00.m_size = (size_t)this_03;
            name_00.field_0.m_data = in_stack_fffffffffffffde8.m_data;
            QVar30 = QColor::fromString(name_00);
            local_b8.d = QVar30._0_8_;
            local_b8.ptr._0_6_ = QVar30.ct._4_6_;
            if (QVar30.cspec == Invalid) {
              __begin6.tokenizer._0_4_ = 2;
              __begin6.tokenizer._4_4_ = 0;
              __begin6.current.value.m_size._0_4_ = 0;
              __begin6.current.value.m_size._4_4_ = 0;
              __begin6.current.value.m_data._0_4_ = 0;
              __begin6.current.value.m_data._4_4_ = 0;
              __begin6.current._16_8_ = (long)"x-default" + 2;
              QString::toLatin1_helper((QString *)&local_58);
              pcVar26 = (char16_t *)local_58.m_haystack.m_size;
              if ((char16_t *)local_58.m_haystack.m_size == (char16_t *)0x0) {
                pcVar26 = (char16_t *)&QByteArray::_empty;
              }
              QMessageLogger::warning
                        ((char *)&__begin6,
                         "QTextHtmlParser::applyAttributes: Unknown color name \'%s\'",pcVar26);
              QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_58);
            }
            QBrush::QBrush((QBrush *)&__begin6,(QColor *)&local_b8,SolidPattern);
            QTextFormat::setForeground(&this_00->super_QTextFormat,(QBrush *)&__begin6);
LAB_00497dfc:
            QBrush::~QBrush((QBrush *)&__begin6);
          }
        }
        break;
      case Html_ul:
      case Html_ol:
        __begin6.tokenizer._0_4_ = 4;
        __begin6.tokenizer._4_4_ = 0;
        __begin6.current.value.m_size._0_4_ = 0x615856;
        __begin6.current.value.m_size._4_4_ = 0;
        bVar17 = ::operator==((QString *)&local_118,(QLatin1StringView *)&__begin6);
        if (bVar17) {
          this_03->field_0x90 = this_03->field_0x90 | 4;
          __begin6.tokenizer._0_4_ = 1;
          __begin6.tokenizer._4_4_ = 0;
          __begin6.current.value.m_size._0_4_ = 0x609f02;
          __begin6.current.value.m_size._4_4_ = 0;
          pQVar31 = this_03;
          bVar17 = ::operator==((QString *)&local_138,(QLatin1StringView *)&__begin6);
          if (bVar17) {
            this_03->listStyle = ListDecimal;
            this_03 = pQVar31;
          }
          else {
            __begin6.tokenizer._0_4_ = 1;
            __begin6.tokenizer._4_4_ = 0;
            __begin6.current.value.m_size._0_4_ = 0x614bcb;
            __begin6.current.value.m_size._4_4_ = 0;
            bVar17 = ::operator==((QString *)&local_138,(QLatin1StringView *)&__begin6);
            if (bVar17) {
              pQVar31->listStyle = ListLowerAlpha;
              this_03 = pQVar31;
            }
            else {
              __begin6.tokenizer._0_4_ = 1;
              __begin6.tokenizer._4_4_ = 0;
              __begin6.current.value.m_size._0_4_ = 0x5ebcd8;
              __begin6.current.value.m_size._4_4_ = 0;
              bVar17 = ::operator==((QString *)&local_138,(QLatin1StringView *)&__begin6);
              if (bVar17) {
                pQVar31->listStyle = ListUpperAlpha;
                this_03 = pQVar31;
              }
              else {
                __begin6.tokenizer._0_4_ = 1;
                __begin6.tokenizer._4_4_ = 0;
                __begin6.current.value.m_size._0_4_ = 0x5f63a8;
                __begin6.current.value.m_size._4_4_ = 0;
                bVar17 = ::operator==((QString *)&local_138,(QLatin1StringView *)&__begin6);
                if (bVar17) {
                  pQVar31->listStyle = ListLowerRoman;
                  this_03 = pQVar31;
                }
                else {
                  __begin6.tokenizer._0_4_ = 1;
                  __begin6.tokenizer._4_4_ = CaseInsensitive;
                  __begin6.current.value.m_size._0_4_ = 0x5df3c1;
                  __begin6.current.value.m_size._4_4_ = 0;
                  bVar17 = ::operator==((QString *)&local_138,(QLatin1StringView *)&__begin6);
                  if (bVar17) {
                    pQVar31->listStyle = ListUpperRoman;
                    this_03 = pQVar31;
                  }
                  else {
                    QString::toLower_helper((QString *)&__begin6);
                    QVar12.m_cs = __begin6.tokenizer._4_4_;
                    QVar12.m_sb.super_QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>.
                    super_QFlagsStorage<Qt::SplitBehaviorFlags>.i =
                         (QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>)
                         (QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>)__begin6.tokenizer._0_4_;
                    pcVar26 = (char16_t *)
                              CONCAT44(__begin6.current.value.m_size._4_4_,
                                       (undefined4)__begin6.current.value.m_size);
                    __begin6.tokenizer._0_4_ = (Int)local_138.d;
                    __begin6.tokenizer._4_4_ = (CaseSensitivity)((ulong)local_138.d >> 0x20);
                    __begin6.current.value.m_size._0_4_ = SUB84(local_138.ptr,0);
                    __begin6.current.value.m_size._4_4_ = (undefined4)((ulong)local_138.ptr >> 0x20)
                    ;
                    pcVar16 = (char16_t *)
                              CONCAT44(__begin6.current.value.m_data._4_4_,
                                       __begin6.current.value.m_data._0_4_);
                    __begin6.current.value.m_data._0_4_ = (undefined4)local_138.size;
                    __begin6.current.value.m_data._4_4_ =
                         (undefined4)((ulong)local_138.size >> 0x20);
                    local_138.d = (Data *)QVar12;
                    local_138.ptr = pcVar26;
                    local_138.size = (qsizetype)pcVar16;
                    QArrayDataPointer<char16_t>::~QArrayDataPointer
                              ((QArrayDataPointer<char16_t> *)&__begin6);
                    __begin6.tokenizer._0_4_ = 6;
                    __begin6.tokenizer._4_4_ = 0;
                    __begin6.current.value.m_size._0_4_ = 0x5fe939;
                    __begin6.current.value.m_size._4_4_ = 0;
                    bVar17 = ::operator==((QString *)&local_138,(QLatin1StringView *)&__begin6);
                    if (bVar17) {
                      pQVar31->listStyle = ListSquare;
                      this_03 = pQVar31;
                    }
                    else {
                      __begin6.tokenizer._0_4_ = 4;
                      __begin6.tokenizer._4_4_ = 0;
                      __begin6.current.value.m_size._0_4_ = 0x5fe940;
                      __begin6.current.value.m_size._4_4_ = 0;
                      bVar17 = ::operator==((QString *)&local_138,(QLatin1StringView *)&__begin6);
                      if (bVar17) {
                        pQVar31->listStyle = ListDisc;
                        this_03 = pQVar31;
                      }
                      else {
                        __begin6.tokenizer._0_4_ = 6;
                        __begin6.tokenizer._4_4_ = 0;
                        __begin6.current.value.m_size._0_4_ = 0x5fe945;
                        __begin6.current.value.m_size._4_4_ = 0;
                        bVar17 = ::operator==((QString *)&local_138,(QLatin1StringView *)&__begin6);
                        if (bVar17) {
                          pQVar31->listStyle = ListCircle;
                          this_03 = pQVar31;
                        }
                        else {
                          __begin6.tokenizer._0_4_ = 4;
                          __begin6.tokenizer._4_4_ = 0;
                          __begin6.current.value.m_size._0_4_ = 0x5cd498;
                          __begin6.current.value.m_size._4_4_ = 0;
                          bVar17 = ::operator==((QString *)&local_138,(QLatin1StringView *)&__begin6
                                               );
                          this_03 = pQVar31;
                          if (bVar17) {
                            pQVar31->listStyle = ListStyleUndefined;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        else {
          __begin6.tokenizer._0_4_ = 5;
          __begin6.tokenizer._4_4_ = 0;
          __begin6.current.value.m_size._0_4_ = 0x5fe94c;
          __begin6.current.value.m_size._4_4_ = 0;
          bVar17 = ::operator==((QString *)&local_118,(QLatin1StringView *)&__begin6);
          if (bVar17) {
            setIntAttribute(destination_02,(QString *)&local_138);
          }
        }
        break;
      case Html_li:
        __begin6.tokenizer._0_4_ = 5;
        __begin6.tokenizer._4_4_ = 0;
        __begin6.current.value.m_size._0_4_ = 0x5fe952;
        __begin6.current.value.m_size._4_4_ = 0;
        bVar17 = ::operator==((QString *)&local_118,(QLatin1StringView *)&__begin6);
        if (bVar17) {
          __begin6.tokenizer._0_4_ = 9;
          __begin6.tokenizer._4_4_ = 0;
          __begin6.current.value.m_size._0_4_ = 0x5fe958;
          __begin6.current.value.m_size._4_4_ = 0;
          bVar17 = ::operator==((QString *)&local_138,(QLatin1StringView *)&__begin6);
          if (bVar17) {
            marker = Unchecked;
          }
          else {
            __begin6.tokenizer._0_4_ = 7;
            __begin6.tokenizer._4_4_ = 0;
            __begin6.current.value.m_size._0_4_ = 0x5fe95a;
            __begin6.current.value.m_size._4_4_ = 0;
            bVar17 = ::operator==((QString *)&local_138,(QLatin1StringView *)&__begin6);
            if (!bVar17) break;
            marker = Checked;
          }
          QTextBlockFormat::setMarker(this_01,marker);
        }
        break;
      case Html_code:
      case Html_tt:
      case Html_kbd:
      case Html_samp:
      case Html_br:
      case Html_sub:
      case Html_sup:
        break;
      case Html_img:
        __begin6.tokenizer._0_4_ = 3;
        __begin6.tokenizer._4_4_ = 0;
        __begin6.current.value.m_size._0_4_ = 0x5faeca;
        __begin6.current.value.m_size._4_4_ = 0;
        bVar17 = ::operator==((QString *)&local_118,(QLatin1StringView *)&__begin6);
        pQVar28 = &pQVar8->d;
        if (!bVar17) {
          local_58.super_QStringTokenizerBaseBase.m_sb.
          super_QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>.
          super_QFlagsStorage<Qt::SplitBehaviorFlags>.i =
               (QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>)0x6;
          local_58.super_QStringTokenizerBaseBase.m_cs = CaseInsensitive;
          local_58.m_haystack.m_size = 0x5fe962;
          bVar17 = ::operator==((QString *)&local_118,(QLatin1StringView *)&local_58);
          if (!bVar17) {
            __begin6.tokenizer._0_4_ = 5;
            __begin6.tokenizer._4_4_ = 0;
            __begin6.current.value.m_size._0_4_ = 0x5fbaba;
            __begin6.current.value.m_size._4_4_ = 0;
            bVar17 = ::operator==((QString *)&local_118,(QLatin1StringView *)&__begin6);
            destination_03 = pqVar7;
            if (!bVar17) {
              __begin6.tokenizer._0_4_ = 6;
              __begin6.tokenizer._4_4_ = 0;
              __begin6.current.value.m_size._0_4_ = 0x60dff5;
              __begin6.current.value.m_size._4_4_ = 0;
              bVar17 = ::operator==((QString *)&local_118,(QLatin1StringView *)&__begin6);
              destination_03 = pqVar6;
              if (!bVar17) {
                __begin6.tokenizer._0_4_ = 3;
                __begin6.tokenizer._4_4_ = 0;
                __begin6.current.value.m_size._0_4_ = 0x5faece;
                __begin6.current.value.m_size._4_4_ = 0;
                bVar17 = ::operator==((QString *)&local_118,(QLatin1StringView *)&__begin6);
                pQVar28 = &pQVar5->d;
                if (bVar17) goto LAB_00497a5c;
                __begin6.tokenizer._0_4_ = 5;
                __begin6.tokenizer._4_4_ = 0;
                __begin6.current.value.m_size._0_4_ = 0x5d0172;
                __begin6.current.value.m_size._4_4_ = 0;
                bVar17 = ::operator==((QString *)&local_118,(QLatin1StringView *)&__begin6);
                pQVar28 = &pQVar1->d;
                if (!bVar17) break;
                goto LAB_00497e8d;
              }
            }
            *destination_03 = -2.0;
LAB_004982d9:
            setFloatAttribute(destination_03,(QString *)&local_138);
            break;
          }
        }
LAB_00497e8d:
        QString::operator=((QString *)pQVar28,(QString *)&local_138);
        break;
      case Html_hr:
        __begin6.tokenizer._0_4_ = 5;
        __begin6.tokenizer._4_4_ = 0;
        __begin6.current.value.m_size._0_4_ = 0x5fbaba;
        __begin6.current.value.m_size._4_4_ = 0;
        bVar17 = ::operator==((QString *)&local_118,(QLatin1StringView *)&__begin6);
        width_00 = width;
        if (bVar17) {
LAB_004977cf:
          setWidthAttribute(width_00,(QString *)&local_138);
        }
        break;
      case Html_pre:
        __begin6.tokenizer._0_4_ = 5;
        __begin6.tokenizer._4_4_ = 0;
        __begin6.current.value.m_size._0_4_ = 0x5fe952;
        __begin6.current.value.m_size._4_4_ = 0;
        bVar17 = ::operator==((QString *)&local_118,(QLatin1StringView *)&__begin6);
        if ((bVar17) &&
           (cVar18 = QString::startsWith((QLatin1String *)&local_138,9), cVar18 != '\0')) {
          QString::mid((longlong)&local_58,(longlong)&local_138);
          ::QVariant::QVariant((QVariant *)&__begin6,(QString *)&local_58);
          QTextFormat::setProperty(&this_01->super_QTextFormat,0x1090,(QVariant *)&__begin6);
          ::QVariant::~QVariant((QVariant *)&__begin6);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
        }
        break;
      default:
        switch(QVar10) {
        case Html_table:
          __begin6.tokenizer._0_4_ = 6;
          __begin6.tokenizer._4_4_ = 0;
          __begin6.current.value.m_size._0_4_ = 0x5fb165;
          __begin6.current.value.m_size._4_4_ = 0;
          bVar17 = ::operator==((QString *)&local_118,(QLatin1StringView *)&__begin6);
          if (((!bVar17) || (dVar9 = *destination, dVar9 != 0.0)) || (NAN(dVar9))) {
            __begin6.tokenizer._0_4_ = 7;
            __begin6.tokenizer._4_4_ = 0;
            __begin6.current.value.m_size._0_4_ = 0x5fb155;
            __begin6.current.value.m_size._4_4_ = 0;
            bVar17 = ::operator==((QString *)&local_118,(QLatin1StringView *)&__begin6);
            if (!bVar17) {
              __begin6.tokenizer._0_4_ = 0xb;
              __begin6.tokenizer._4_4_ = 0;
              __begin6.current.value.m_size._0_4_ = 0x5fe969;
              __begin6.current.value.m_size._4_4_ = 0;
              bVar17 = ::operator==((QString *)&local_118,(QLatin1StringView *)&__begin6);
              if (!bVar17) {
                __begin6.tokenizer._0_4_ = 10;
                __begin6.tokenizer._4_4_ = 0;
                __begin6.current.value.m_size._0_4_ = 0x5fb14a;
                __begin6.current.value.m_size._4_4_ = 0;
                bVar17 = ::operator==((QString *)&local_118,(QLatin1StringView *)&__begin6);
                if (bVar17) goto LAB_0049823c;
                __begin6.tokenizer._0_4_ = 0xb;
                __begin6.tokenizer._4_4_ = 0;
                __begin6.current.value.m_size._0_4_ = 0x5fb16c;
                __begin6.current.value.m_size._4_4_ = 0;
                bVar17 = ::operator==((QString *)&local_118,(QLatin1StringView *)&__begin6);
                destination_03 = pqVar4;
                if (!bVar17) {
                  __begin6.tokenizer._0_4_ = 0xb;
                  __begin6.tokenizer._4_4_ = 0;
                  __begin6.current.value.m_size._0_4_ = 0x5fb178;
                  __begin6.current.value.m_size._4_4_ = 0;
                  bVar17 = ::operator==((QString *)&local_118,(QLatin1StringView *)&__begin6);
                  destination_03 = pqVar3;
                  if (!bVar17) {
                    __begin6.tokenizer._0_4_ = 5;
                    __begin6.tokenizer._4_4_ = 0;
                    __begin6.current.value.m_size._0_4_ = 0x5fbaba;
                    __begin6.current.value.m_size._4_4_ = 0;
                    bVar17 = ::operator==((QString *)&local_118,(QLatin1StringView *)&__begin6);
                    if (bVar17) goto LAB_0049763a;
                    __begin6.tokenizer._0_4_ = 6;
                    __begin6.tokenizer._4_4_ = 0;
                    __begin6.current.value.m_size._0_4_ = 0x60dff5;
                    __begin6.current.value.m_size._4_4_ = 0;
                    bVar17 = ::operator==((QString *)&local_118,(QLatin1StringView *)&__begin6);
                    width_00 = pQVar2;
                    if (bVar17) goto LAB_004977cf;
                    break;
                  }
                }
                goto LAB_004982d9;
              }
              name_01.m_size = (size_t)this_03;
              name_01.field_0.m_data = in_stack_fffffffffffffde8.m_data;
              QVar30 = QColor::fromString(name_01);
              if (QVar30.cspec == Invalid) {
                __begin6.tokenizer._0_4_ = 2;
                __begin6.tokenizer._4_4_ = 0;
                __begin6.current.value.m_size._0_4_ = 0;
                __begin6.current.value.m_size._4_4_ = 0;
                __begin6.current.value.m_data._0_4_ = 0;
                __begin6.current.value.m_data._4_4_ = 0;
                __begin6.current._16_8_ = (long)"x-default" + 2;
                QString::toLatin1_helper((QString *)&local_58);
                pcVar26 = (char16_t *)local_58.m_haystack.m_size;
                if ((char16_t *)local_58.m_haystack.m_size == (char16_t *)0x0) {
                  pcVar26 = (char16_t *)&QByteArray::_empty;
                }
                QMessageLogger::warning
                          ((char *)&__begin6,
                           "QTextHtmlParser::applyAttributes: Unknown color name \'%s\'",pcVar26);
                QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_58);
              }
              color._8_8_ = QVar30._8_8_ & 0xffffffffffff | 0xaaaa000000000000;
              color._0_8_ = QVar30._0_8_;
              QBrush::operator=(this_02,color);
              break;
            }
LAB_00497d83:
            local_b8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
            local_b8.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
            name.m_size = (size_t)this_03;
            name.field_0.m_data = in_stack_fffffffffffffde8.m_data;
            QVar30 = QColor::fromString(name);
            local_b8.d = QVar30._0_8_;
            local_b8.ptr._0_6_ = QVar30.ct._4_6_;
            if (QVar30.cspec == Invalid) {
              __begin6.tokenizer._0_4_ = 2;
              __begin6.tokenizer._4_4_ = 0;
              __begin6.current.value.m_size._0_4_ = 0;
              __begin6.current.value.m_size._4_4_ = 0;
              __begin6.current.value.m_data._0_4_ = 0;
              __begin6.current.value.m_data._4_4_ = 0;
              __begin6.current._16_8_ = (long)"x-default" + 2;
              QString::toLatin1_helper((QString *)&local_58);
              pcVar26 = (char16_t *)local_58.m_haystack.m_size;
              if ((char16_t *)local_58.m_haystack.m_size == (char16_t *)0x0) {
                pcVar26 = (char16_t *)&QByteArray::_empty;
              }
              QMessageLogger::warning
                        ((char *)&__begin6,
                         "QTextHtmlParser::applyAttributes: Unknown color name \'%s\'",pcVar26);
              QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_58);
            }
            QBrush::QBrush((QBrush *)&__begin6,(QColor *)&local_b8,SolidPattern);
            QTextFormat::setBackground(&this_00->super_QTextFormat,(QBrush *)&__begin6);
            goto LAB_00497dfc;
          }
          setFloatAttribute(destination,(QString *)&local_138);
          break;
        case Html_tr:
switchD_00497609_caseD_2e:
          __begin6.tokenizer._0_4_ = 7;
          __begin6.tokenizer._4_4_ = 0;
          __begin6.current.value.m_size._0_4_ = 0x5fb155;
          __begin6.current.value.m_size._4_4_ = 0;
          bVar17 = ::operator==((QString *)&local_118,(QLatin1StringView *)&__begin6);
          if (bVar17) goto LAB_00497d83;
          __begin6.tokenizer._0_4_ = 10;
          __begin6.tokenizer._4_4_ = 0;
          __begin6.current.value.m_size._0_4_ = 0x5fb14a;
          __begin6.current.value.m_size._4_4_ = 0;
          bVar17 = ::operator==((QString *)&local_118,(QLatin1StringView *)&__begin6);
          if (bVar17) {
            QTextHtmlParserNode::applyBackgroundImage
                      (this_03,(QString *)&local_138,this->resourceProvider);
          }
          break;
        case Html_td:
        case Html_th:
          __begin6.tokenizer._0_4_ = 5;
          __begin6.tokenizer._4_4_ = 0;
          __begin6.current.value.m_size._0_4_ = 0x5fbaba;
          __begin6.current.value.m_size._4_4_ = 0;
          bVar17 = ::operator==((QString *)&local_118,(QLatin1StringView *)&__begin6);
          if (bVar17) {
LAB_0049763a:
            setWidthAttribute(width,(QString *)&local_138);
          }
          else {
            __begin6.tokenizer._0_4_ = 7;
            __begin6.tokenizer._4_4_ = 0;
            __begin6.current.value.m_size._0_4_ = 0x5fb155;
            __begin6.current.value.m_size._4_4_ = 0;
            bVar17 = ::operator==((QString *)&local_118,(QLatin1StringView *)&__begin6);
            if (bVar17) goto LAB_00497d83;
            __begin6.tokenizer._0_4_ = 10;
            __begin6.tokenizer._4_4_ = 0;
            __begin6.current.value.m_size._0_4_ = 0x5fb14a;
            __begin6.current.value.m_size._4_4_ = 0;
            bVar17 = ::operator==((QString *)&local_118,(QLatin1StringView *)&__begin6);
            if (bVar17) {
LAB_0049823c:
              QTextHtmlParserNode::applyBackgroundImage
                        (this_03,(QString *)&local_138,this->resourceProvider);
            }
            else {
              __begin6.tokenizer._0_4_ = 7;
              __begin6.tokenizer._4_4_ = 0;
              __begin6.current.value.m_size._0_4_ = 0x5fb19f;
              __begin6.current.value.m_size._4_4_ = 0;
              bVar17 = ::operator==((QString *)&local_118,(QLatin1StringView *)&__begin6);
              if (bVar17) {
                bVar17 = setIntAttribute(destination_01,(QString *)&local_138);
                if (bVar17) {
                  iVar27 = *destination_01;
                  if (iVar27 < 2) {
                    iVar27 = 1;
                  }
                  *destination_01 = iVar27;
                }
              }
              else {
                __begin6.tokenizer._0_4_ = 7;
                __begin6.tokenizer._4_4_ = 0;
                __begin6.current.value.m_size._0_4_ = 0x5fb197;
                __begin6.current.value.m_size._4_4_ = 0;
                bVar17 = ::operator==((QString *)&local_118,(QLatin1StringView *)&__begin6);
                if ((bVar17) &&
                   (bVar17 = setIntAttribute(destination_00,(QString *)&local_138), bVar17)) {
                  uVar11 = *destination_00;
                  uVar24 = 0x5000;
                  if (uVar11 < 0x5000) {
                    uVar24 = uVar11;
                  }
                  if ((int)uVar11 < 2) {
                    uVar24 = 1;
                  }
                  *destination_00 = uVar24;
                }
              }
            }
          }
          break;
        case Html_thead:
        case Html_tbody:
        case Html_tfoot:
        case Html_caption:
        case Html_html:
        case Html_style:
        case Html_title:
          break;
        case Html_meta:
          __begin6.tokenizer._0_4_ = 4;
          __begin6.tokenizer._4_4_ = 0;
          __begin6.current.value.m_size._0_4_ = 0x60df06;
          __begin6.current.value.m_size._4_4_ = 0;
          bVar17 = ::operator==((QString *)&local_118,(QLatin1StringView *)&__begin6);
          if (bVar17) {
            local_58.super_QStringTokenizerBaseBase.m_sb.
            super_QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>.
            super_QFlagsStorage<Qt::SplitBehaviorFlags>.i =
                 (QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>)0x9;
            local_58.super_QStringTokenizerBaseBase.m_cs = CaseInsensitive;
            local_58.m_haystack.m_size = 0x5fe975;
            bVar17 = ::operator==((QString *)&local_138,(QLatin1StringView *)&local_58);
            bVar23 = bVar23 | bVar17;
          }
          __begin6.tokenizer._0_4_ = 7;
          __begin6.tokenizer._4_4_ = 0;
          __begin6.current.value.m_size._0_4_ = 0x60e54b;
          __begin6.current.value.m_size._4_4_ = 0;
          bVar17 = ::operator==((QString *)&local_118,(QLatin1StringView *)&__begin6);
          if (bVar17) {
            local_58.super_QStringTokenizerBaseBase.m_sb.
            super_QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>.
            super_QFlagsStorage<Qt::SplitBehaviorFlags>.i =
                 (QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>)0x1;
            local_58.super_QStringTokenizerBaseBase.m_cs = CaseInsensitive;
            local_58.m_haystack.m_size = 0x609f02;
            bVar17 = ::operator==((QString *)&local_138,(QLatin1StringView *)&local_58);
            if (bVar17) {
              if (bVar23 == 0) {
                bVar23 = 0;
              }
              else {
                this->textEditMode = true;
                bVar23 = 1;
              }
            }
          }
          break;
        case Html_link:
          __begin6.tokenizer._0_4_ = 4;
          __begin6.tokenizer._4_4_ = 0;
          __begin6.current.value.m_size._0_4_ = 0x5fe8a4;
          __begin6.current.value.m_size._4_4_ = 0;
          bVar17 = ::operator==((QString *)&local_118,(QLatin1StringView *)&__begin6);
          if (bVar17) {
            pQVar28 = &local_d8;
LAB_00497a5c:
            QString::operator=((QString *)pQVar28,(QString *)&local_138);
          }
          else {
            __begin6.tokenizer._0_4_ = 4;
            __begin6.tokenizer._4_4_ = 0;
            __begin6.current.value.m_size._0_4_ = 0x615856;
            __begin6.current.value.m_size._4_4_ = 0;
            bVar17 = ::operator==((QString *)&local_118,(QLatin1StringView *)&__begin6);
            if (bVar17) {
              pQVar28 = &local_f8;
              goto LAB_00497e8d;
            }
          }
          break;
        default:
          if (QVar10 == Html_body) goto switchD_00497609_caseD_2e;
          if (QVar10 == Html_a) {
            __begin6.tokenizer._0_4_ = 4;
            __begin6.tokenizer._4_4_ = 0;
            __begin6.current.value.m_size._0_4_ = 0x5fe8a4;
            __begin6.current.value.m_size._4_4_ = 0;
            bVar17 = ::operator==((QString *)&local_118,(QLatin1StringView *)&__begin6);
            if (bVar17) {
              QTextCharFormat::setAnchorHref(this_00,(QString *)&local_138);
            }
            else {
              __begin6.tokenizer._0_4_ = 4;
              __begin6.tokenizer._4_4_ = 0;
              __begin6.current.value.m_size._0_4_ = 0x60df06;
              __begin6.current.value.m_size._4_4_ = 0;
              bVar17 = ::operator==((QString *)&local_118,(QLatin1StringView *)&__begin6);
              if (bVar17) {
                local_58.super_QStringTokenizerBaseBase = (QStringTokenizerBaseBase)local_138.d;
                local_58.m_haystack.m_size = (qsizetype)local_138.ptr;
                local_58.m_haystack.m_data = (storage_type_conflict *)local_138.size;
                if ((QStringTokenizerBaseBase)local_138.d != (QStringTokenizerBaseBase)0x0) {
                  LOCK();
                  *(int *)local_138.d = *(int *)local_138.d + 1;
                  UNLOCK();
                }
                args._M_len = 1;
                args._M_array = (iterator)&local_58;
                QList<QString>::QList((QList<QString> *)&__begin6,args);
                QTextCharFormat::setAnchorNames(this_00,(QStringList *)&__begin6);
                QArrayDataPointer<QString>::~QArrayDataPointer
                          ((QArrayDataPointer<QString> *)&__begin6);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&local_58);
              }
            }
          }
        }
      }
      __begin6.tokenizer._0_4_ = 5;
      __begin6.tokenizer._4_4_ = 0;
      __begin6.current.value.m_size._0_4_ = 0x613de0;
      __begin6.current.value.m_size._4_4_ = 0;
      bVar17 = ::operator==((QString *)&local_118,(QLatin1StringView *)&__begin6);
      if (bVar17) {
        QTextHtmlParserNode::parseStyleAttribute
                  (this_03,(QString *)&local_138,this->resourceProvider);
      }
      else {
        __begin6.tokenizer._0_4_ = 5;
        __begin6.tokenizer._4_4_ = CaseInsensitive;
        __begin6.current.value.m_size._0_4_ = 0x60e8c5;
        __begin6.current.value.m_size._4_4_ = 0;
        bVar17 = ::operator==((QString *)&local_118,(QLatin1StringView *)&__begin6);
        if (bVar17) {
          QString::toLower_helper((QString *)&__begin6);
          QVar13.m_cs = __begin6.tokenizer._4_4_;
          QVar13.m_sb.super_QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>.
          super_QFlagsStorage<Qt::SplitBehaviorFlags>.i =
               (QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>)
               (QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>)__begin6.tokenizer._0_4_;
          pcVar26 = (char16_t *)
                    CONCAT44(__begin6.current.value.m_size._4_4_,
                             (undefined4)__begin6.current.value.m_size);
          __begin6.tokenizer._0_4_ = (Int)local_138.d;
          __begin6.tokenizer._4_4_ = (CaseSensitivity)((ulong)local_138.d >> 0x20);
          __begin6.current.value.m_size._0_4_ = SUB84(local_138.ptr,0);
          __begin6.current.value.m_size._4_4_ = (undefined4)((ulong)local_138.ptr >> 0x20);
          pcVar16 = (char16_t *)
                    CONCAT44(__begin6.current.value.m_data._4_4_,__begin6.current.value.m_data._0_4_
                            );
          __begin6.current.value.m_data._0_4_ = (undefined4)local_138.size;
          __begin6.current.value.m_data._4_4_ = (undefined4)((ulong)local_138.size >> 0x20);
          local_138.d = (Data *)QVar13;
          local_138.ptr = pcVar26;
          local_138.size = (qsizetype)pcVar16;
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&__begin6);
          __begin6.tokenizer._0_4_ = 4;
          __begin6.tokenizer._4_4_ = 0;
          __begin6.current.value.m_size._0_4_ = 0x60884b;
          __begin6.current.value.m_size._4_4_ = 0;
          bVar17 = ::operator==((QString *)&local_138,(QLatin1StringView *)&__begin6);
          aalignment.i = 0x11;
          if (!bVar17) {
            __begin6.tokenizer._0_4_ = 5;
            __begin6.tokenizer._4_4_ = 0;
            __begin6.current.value.m_size._0_4_ = 0x60885f;
            __begin6.current.value.m_size._4_4_ = 0;
            bVar17 = ::operator==((QString *)&local_138,(QLatin1StringView *)&__begin6);
            aalignment.i = 0x12;
            if (!bVar17) {
              __begin6.tokenizer._0_4_ = 6;
              __begin6.tokenizer._4_4_ = 0;
              __begin6.current.value.m_size._0_4_ = 0x5fe989;
              __begin6.current.value.m_size._4_4_ = 0;
              bVar17 = ::operator==((QString *)&local_138,(QLatin1StringView *)&__begin6);
              aalignment.i = 4;
              if (!bVar17) {
                __begin6.tokenizer._0_4_ = 7;
                __begin6.tokenizer._4_4_ = 0;
                __begin6.current.value.m_size._0_4_ = 0x5fe990;
                __begin6.current.value.m_size._4_4_ = 0;
                bVar17 = ::operator==((QString *)&local_138,(QLatin1StringView *)&__begin6);
                aalignment.i = 8;
                if (!bVar17) {
                  if (this_03->id == Html_img) {
                    __begin6.tokenizer._0_4_ = 6;
                    __begin6.tokenizer._4_4_ = 0;
                    __begin6.current.value.m_size._0_4_ = 0x5fac71;
                    __begin6.current.value.m_size._4_4_ = 0;
                    bVar17 = ::operator==((QString *)&local_138,(QLatin1StringView *)&__begin6);
                    if (bVar17) goto LAB_00498b49;
                    __begin6.tokenizer._0_4_ = 3;
                    __begin6.tokenizer._4_4_ = 0;
                    __begin6.current.value.m_size._0_4_ = 0x60e338;
                    __begin6.current.value.m_size._4_4_ = 0;
                    bVar17 = ::operator==((QString *)&local_138,(QLatin1StringView *)&__begin6);
                    if (bVar17) goto LAB_00498a4f;
                  }
                  goto LAB_004987c7;
                }
              }
            }
          }
          QTextBlockFormat::setAlignment(this_01,(Alignment)aalignment.i);
          if (this_03->id == Html_img) {
            AVar20 = QTextBlockFormat::alignment(this_01);
            if (((uint)AVar20.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                       super_QFlagsStorage<Qt::AlignmentFlag>.i & 1) == 0) {
              AVar20 = QTextBlockFormat::alignment(this_01);
              if (((uint)AVar20.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                         super_QFlagsStorage<Qt::AlignmentFlag>.i & 2) != 0) {
                *(ushort *)&this_03->field_0x90 =
                     (ushort)*(undefined4 *)&this_03->field_0x90 & 0xfffc | 2;
              }
            }
            else {
              *(ushort *)&this_03->field_0x90 =
                   ((ushort)*(undefined4 *)&this_03->field_0x90 & 0xfffc) + 1;
            }
          }
        }
        else {
          __begin6.tokenizer._0_4_ = 6;
          __begin6.tokenizer._4_4_ = CaseInsensitive;
          __begin6.current.value.m_size._0_4_ = 0x5fe998;
          __begin6.current.value.m_size._4_4_ = 0;
          bVar17 = ::operator==((QString *)&local_118,(QLatin1StringView *)&__begin6);
          if (bVar17) {
            QString::toLower_helper((QString *)&__begin6);
            QVar14.m_cs = __begin6.tokenizer._4_4_;
            QVar14.m_sb.super_QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>.
            super_QFlagsStorage<Qt::SplitBehaviorFlags>.i =
                 (QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>)
                 (QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>)__begin6.tokenizer._0_4_;
            pcVar26 = (char16_t *)
                      CONCAT44(__begin6.current.value.m_size._4_4_,
                               (undefined4)__begin6.current.value.m_size);
            __begin6.tokenizer._0_4_ = (Int)local_138.d;
            __begin6.tokenizer._4_4_ = (CaseSensitivity)((ulong)local_138.d >> 0x20);
            __begin6.current.value.m_size._0_4_ = SUB84(local_138.ptr,0);
            __begin6.current.value.m_size._4_4_ = (undefined4)((ulong)local_138.ptr >> 0x20);
            pcVar16 = (char16_t *)
                      CONCAT44(__begin6.current.value.m_data._4_4_,
                               __begin6.current.value.m_data._0_4_);
            __begin6.current.value.m_data._0_4_ = (undefined4)local_138.size;
            __begin6.current.value.m_data._4_4_ = (undefined4)((ulong)local_138.size >> 0x20);
            local_138.d = (Data *)QVar14;
            local_138.ptr = pcVar26;
            local_138.size = (qsizetype)pcVar16;
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&__begin6);
            __begin6.tokenizer._0_4_ = 3;
            __begin6.tokenizer._4_4_ = 0;
            __begin6.current.value.m_size._0_4_ = 0x60e338;
            __begin6.current.value.m_size._4_4_ = 0;
            bVar17 = ::operator==((QString *)&local_138,(QLatin1StringView *)&__begin6);
            if (bVar17) {
LAB_00498a4f:
              alignment = AlignTop;
            }
            else {
              __begin6.tokenizer._0_4_ = 6;
              __begin6.tokenizer._4_4_ = 0;
              __begin6.current.value.m_size._0_4_ = 0x5fac71;
              __begin6.current.value.m_size._4_4_ = 0;
              bVar17 = ::operator==((QString *)&local_138,(QLatin1StringView *)&__begin6);
              if (bVar17) {
LAB_00498b49:
                alignment = AlignMiddle;
              }
              else {
                __begin6.tokenizer._0_4_ = 6;
                __begin6.tokenizer._4_4_ = 0;
                __begin6.current.value.m_size._0_4_ = 0x60e344;
                __begin6.current.value.m_size._4_4_ = 0;
                bVar17 = ::operator==((QString *)&local_138,(QLatin1StringView *)&__begin6);
                if (!bVar17) goto LAB_004987c7;
                alignment = AlignBottom;
              }
            }
            QTextCharFormat::setVerticalAlignment(this_00,alignment);
          }
          else {
            __begin6.tokenizer._0_4_ = 3;
            __begin6.tokenizer._4_4_ = CaseInsensitive;
            __begin6.current.value.m_size._0_4_ = 0x5fe99f;
            __begin6.current.value.m_size._4_4_ = 0;
            bVar17 = ::operator==((QString *)&local_118,(QLatin1StringView *)&__begin6);
            if (bVar17) {
              QString::toLower_helper((QString *)&__begin6);
              QVar15.m_cs = __begin6.tokenizer._4_4_;
              QVar15.m_sb.super_QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>.
              super_QFlagsStorage<Qt::SplitBehaviorFlags>.i =
                   (QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>)
                   (QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>)__begin6.tokenizer._0_4_;
              pcVar26 = (char16_t *)
                        CONCAT44(__begin6.current.value.m_size._4_4_,
                                 (undefined4)__begin6.current.value.m_size);
              __begin6.tokenizer._0_4_ = (Int)local_138.d;
              __begin6.tokenizer._4_4_ = (CaseSensitivity)((ulong)local_138.d >> 0x20);
              __begin6.current.value.m_size._0_4_ = SUB84(local_138.ptr,0);
              __begin6.current.value.m_size._4_4_ = (undefined4)((ulong)local_138.ptr >> 0x20);
              pcVar16 = (char16_t *)
                        CONCAT44(__begin6.current.value.m_data._4_4_,
                                 __begin6.current.value.m_data._0_4_);
              __begin6.current.value.m_data._0_4_ = (undefined4)local_138.size;
              __begin6.current.value.m_data._4_4_ = (undefined4)((ulong)local_138.size >> 0x20);
              local_138.d = (Data *)QVar15;
              local_138.ptr = pcVar26;
              local_138.size = (qsizetype)pcVar16;
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&__begin6);
              __begin6.tokenizer._0_4_ = 3;
              __begin6.tokenizer._4_4_ = 0;
              __begin6.current.value.m_size._0_4_ = 0x5fe9a3;
              __begin6.current.value.m_size._4_4_ = 0;
              bVar17 = ::operator==((QString *)&local_138,(QLatin1StringView *)&__begin6);
              if (bVar17) {
                direction = LeftToRight;
              }
              else {
                __begin6.tokenizer._0_4_ = 3;
                __begin6.tokenizer._4_4_ = 0;
                __begin6.current.value.m_size._0_4_ = 0x5fe9a7;
                __begin6.current.value.m_size._4_4_ = 0;
                bVar17 = ::operator==((QString *)&local_138,(QLatin1StringView *)&__begin6);
                if (!bVar17) goto LAB_004987c7;
                direction = RightToLeft;
              }
              QTextFormat::setLayoutDirection(&this_01->super_QTextFormat,direction);
            }
            else {
              __begin6.tokenizer._0_4_ = 5;
              __begin6.tokenizer._4_4_ = 0;
              __begin6.current.value.m_size._0_4_ = 0x5d0172;
              __begin6.current.value.m_size._4_4_ = 0;
              bVar17 = ::operator==((QString *)&local_118,(QLatin1StringView *)&__begin6);
              if (bVar17) {
                QTextCharFormat::setToolTip(this_00,(QString *)&local_138);
              }
              else {
                __begin6.tokenizer._0_4_ = 2;
                __begin6.tokenizer._4_4_ = 0;
                __begin6.current.value.m_size._0_4_ = 0x602a00;
                __begin6.current.value.m_size._4_4_ = 0;
                bVar17 = ::operator==((QString *)&local_118,(QLatin1StringView *)&__begin6);
                if (bVar17) {
                  QTextCharFormat::setAnchor(this_00,true);
                  local_58.super_QStringTokenizerBaseBase = (QStringTokenizerBaseBase)local_138.d;
                  local_58.m_haystack.m_size = (qsizetype)local_138.ptr;
                  local_58.m_haystack.m_data = (storage_type_conflict *)local_138.size;
                  if ((QStringTokenizerBaseBase)local_138.d != (QStringTokenizerBaseBase)0x0) {
                    LOCK();
                    *(int *)local_138.d = *(int *)local_138.d + 1;
                    UNLOCK();
                  }
                  args_00._M_len = 1;
                  args_00._M_array = (iterator)&local_58;
                  QList<QString>::QList((QList<QString> *)&__begin6,args_00);
                  QTextCharFormat::setAnchorNames(this_00,(QStringList *)&__begin6);
                  QArrayDataPointer<QString>::~QArrayDataPointer
                            ((QArrayDataPointer<QString> *)&__begin6);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_58);
                }
              }
            }
          }
        }
      }
LAB_004987c7:
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_138);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_118);
    }
    if ((this->resourceProvider != (QTextDocument *)0x0) && (local_d8.size != 0)) {
      __begin6.tokenizer._0_4_ = 8;
      __begin6.tokenizer._4_4_ = 0;
      __begin6.current.value.m_size._0_4_ = 0x5fe9ab;
      __begin6.current.value.m_size._4_4_ = 0;
      bVar17 = ::operator==((QString *)&local_f8,(QLatin1StringView *)&__begin6);
      if (bVar17) {
        importStyleSheet(this,(QString *)&local_d8);
      }
    }
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_f8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextHtmlParser::applyAttributes(const QStringList &attributes)
{
    // local state variable for qt3 textedit mode
    bool seenQt3Richtext = false;
    QString linkHref;
    QString linkType;

    if (attributes.size() % 2 == 1)
        return;

    QTextHtmlParserNode *node = nodes.last();

    for (int i = 0; i < attributes.size(); i += 2) {
        QString key = attributes.at(i);
        QString value = attributes.at(i + 1);

        switch (node->id) {
            case Html_font:
                // the infamous font tag
                if (key == "size"_L1 && value.size()) {
                    int n = value.toInt();
                    if (value.at(0) != u'+' && value.at(0) != u'-')
                        n -= 3;
                    node->charFormat.setProperty(QTextFormat::FontSizeAdjustment, n);
                } else if (key == "face"_L1) {
                    if (value.contains(u',')) {
                        QStringList families;
                        for (auto family : value.tokenize(u','))
                            families << family.trimmed().toString();
                        node->charFormat.setFontFamilies(families);
                    } else {
                        node->charFormat.setFontFamilies(QStringList(value));
                    }
                } else if (key == "color"_L1) {
                    QColor c = QColor::fromString(value);
                    if (!c.isValid())
                        qWarning("QTextHtmlParser::applyAttributes: Unknown color name '%s'",value.toLatin1().constData());
                    node->charFormat.setForeground(c);
                }
                break;
            case Html_ol:
            case Html_ul:
                if (key == "type"_L1) {
                    node->hasOwnListStyle = true;
                    if (value == "1"_L1) {
                        node->listStyle = QTextListFormat::ListDecimal;
                    } else if (value == "a"_L1) {
                        node->listStyle = QTextListFormat::ListLowerAlpha;
                    } else if (value == "A"_L1) {
                        node->listStyle = QTextListFormat::ListUpperAlpha;
                    } else if (value == "i"_L1) {
                        node->listStyle = QTextListFormat::ListLowerRoman;
                    } else if (value == "I"_L1) {
                        node->listStyle = QTextListFormat::ListUpperRoman;
                    } else {
                        value = std::move(value).toLower();
                        if (value == "square"_L1)
                            node->listStyle = QTextListFormat::ListSquare;
                        else if (value == "disc"_L1)
                            node->listStyle = QTextListFormat::ListDisc;
                        else if (value == "circle"_L1)
                            node->listStyle = QTextListFormat::ListCircle;
                        else if (value == "none"_L1)
                            node->listStyle = QTextListFormat::ListStyleUndefined;
                    }
                } else if (key == "start"_L1) {
                    setIntAttribute(&node->listStart, value);
                }
                break;
            case Html_li:
                if (key == "class"_L1) {
                    if (value == "unchecked"_L1)
                        node->blockFormat.setMarker(QTextBlockFormat::MarkerType::Unchecked);
                    else if (value == "checked"_L1)
                        node->blockFormat.setMarker(QTextBlockFormat::MarkerType::Checked);
                }
                break;
            case Html_a:
                if (key == "href"_L1)
                    node->charFormat.setAnchorHref(value);
                else if (key == "name"_L1)
                    node->charFormat.setAnchorNames({value});
                break;
            case Html_img:
                if (key == "src"_L1 || key == "source"_L1) {
                    node->imageName = value;
                } else if (key == "width"_L1) {
                    node->imageWidth = -2; // register that there is a value for it.
                    setFloatAttribute(&node->imageWidth, value);
                } else if (key == "height"_L1) {
                    node->imageHeight = -2; // register that there is a value for it.
                    setFloatAttribute(&node->imageHeight, value);
                } else if (key == "alt"_L1) {
                    node->imageAlt = value;
                } else if (key == "title"_L1) {
                    node->text = value;
                }
                break;
            case Html_tr:
            case Html_body:
                if (key == "bgcolor"_L1) {
                    QColor c = QColor::fromString(value);
                    if (!c.isValid())
                        qWarning("QTextHtmlParser::applyAttributes: Unknown color name '%s'",value.toLatin1().constData());
                    node->charFormat.setBackground(c);
                } else if (key == "background"_L1) {
                    node->applyBackgroundImage(value, resourceProvider);
                }
                break;
            case Html_th:
            case Html_td:
                if (key == "width"_L1) {
                    setWidthAttribute(&node->width, value);
                } else if (key == "bgcolor"_L1) {
                    QColor c = QColor::fromString(value);
                    if (!c.isValid())
                        qWarning("QTextHtmlParser::applyAttributes: Unknown color name '%s'",value.toLatin1().constData());
                    node->charFormat.setBackground(c);
                } else if (key == "background"_L1) {
                    node->applyBackgroundImage(value, resourceProvider);
                } else if (key == "rowspan"_L1) {
                    if (setIntAttribute(&node->tableCellRowSpan, value))
                        node->tableCellRowSpan = qMax(1, node->tableCellRowSpan);
                } else if (key == "colspan"_L1) {
                    if (setIntAttribute(&node->tableCellColSpan, value))
                        node->tableCellColSpan = qBound(1, node->tableCellColSpan, 20480);
                }
                break;
            case Html_table:
                // If table border already set through css style, prefer that one otherwise consider this value
                if (key == "border"_L1 && !node->tableBorder) {
                    setFloatAttribute(&node->tableBorder, value);
                } else if (key == "bgcolor"_L1) {
                    QColor c = QColor::fromString(value);
                    if (!c.isValid())
                        qWarning("QTextHtmlParser::applyAttributes: Unknown color name '%s'",value.toLatin1().constData());
                    node->charFormat.setBackground(c);
                } else if (key == "bordercolor"_L1) {
                    QColor c = QColor::fromString(value);
                    if (!c.isValid())
                        qWarning("QTextHtmlParser::applyAttributes: Unknown color name '%s'",value.toLatin1().constData());
                    node->borderBrush = c;
                } else if (key == "background"_L1) {
                    node->applyBackgroundImage(value, resourceProvider);
                } else if (key == "cellspacing"_L1) {
                    setFloatAttribute(&node->tableCellSpacing, value);
                } else if (key == "cellpadding"_L1) {
                    setFloatAttribute(&node->tableCellPadding, value);
                } else if (key == "width"_L1) {
                    setWidthAttribute(&node->width, value);
                } else if (key == "height"_L1) {
                    setWidthAttribute(&node->height, value);
                }
                break;
            case Html_meta:
                if (key == "name"_L1 && value == "qrichtext"_L1)
                    seenQt3Richtext = true;

                if (key == "content"_L1 && value == "1"_L1 && seenQt3Richtext)
                    textEditMode = true;
                break;
            case Html_hr:
                if (key == "width"_L1)
                    setWidthAttribute(&node->width, value);
                break;
            case Html_link:
                if (key == "href"_L1)
                    linkHref = value;
                else if (key == "type"_L1)
                    linkType = value;
                break;
            case Html_pre:
                if (key == "class"_L1 && value.startsWith("language-"_L1))
                    node->blockFormat.setProperty(QTextFormat::BlockCodeLanguage, value.mid(9));
                break;
            default:
                break;
        }

        if (key == "style"_L1) {
#ifndef QT_NO_CSSPARSER
            node->parseStyleAttribute(value, resourceProvider);
#endif
        } else if (key == "align"_L1) {
            value = std::move(value).toLower();
            bool alignmentSet = true;

            if (value == "left"_L1)
                node->blockFormat.setAlignment(Qt::AlignLeft|Qt::AlignAbsolute);
            else if (value == "right"_L1)
                node->blockFormat.setAlignment(Qt::AlignRight|Qt::AlignAbsolute);
            else if (value == "center"_L1)
                node->blockFormat.setAlignment(Qt::AlignHCenter);
            else if (value == "justify"_L1)
                node->blockFormat.setAlignment(Qt::AlignJustify);
            else
                alignmentSet = false;

            if (node->id == Html_img) {
                // HTML4 compat
                if (alignmentSet) {
                    if (node->blockFormat.alignment() & Qt::AlignLeft)
                        node->cssFloat = QTextFrameFormat::FloatLeft;
                    else if (node->blockFormat.alignment() & Qt::AlignRight)
                        node->cssFloat = QTextFrameFormat::FloatRight;
                } else if (value == "middle"_L1) {
                    node->charFormat.setVerticalAlignment(QTextCharFormat::AlignMiddle);
                } else if (value == "top"_L1) {
                    node->charFormat.setVerticalAlignment(QTextCharFormat::AlignTop);
                }
            }
        } else if (key == "valign"_L1) {
            value = std::move(value).toLower();
            if (value == "top"_L1)
                node->charFormat.setVerticalAlignment(QTextCharFormat::AlignTop);
            else if (value == "middle"_L1)
                node->charFormat.setVerticalAlignment(QTextCharFormat::AlignMiddle);
            else if (value == "bottom"_L1)
                node->charFormat.setVerticalAlignment(QTextCharFormat::AlignBottom);
        } else if (key == "dir"_L1) {
            value = std::move(value).toLower();
            if (value == "ltr"_L1)
                node->blockFormat.setLayoutDirection(Qt::LeftToRight);
            else if (value == "rtl"_L1)
                node->blockFormat.setLayoutDirection(Qt::RightToLeft);
        } else if (key == "title"_L1) {
            node->charFormat.setToolTip(value);
        } else if (key == "id"_L1) {
            node->charFormat.setAnchor(true);
            node->charFormat.setAnchorNames({value});
        }
    }

#ifndef QT_NO_CSSPARSER
    if (resourceProvider && !linkHref.isEmpty() && linkType == "text/css"_L1)
        importStyleSheet(linkHref);
#endif
}